

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O1

void * __thiscall
cbtSortedOverlappingPairCache::removeOverlappingPair
          (cbtSortedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          ,cbtDispatcher *dispatcher)

{
  int *piVar1;
  uint uVar2;
  cbtBroadphasePair *pcVar3;
  cbtOverlappingPairCallback *pcVar4;
  cbtBroadphasePair *pcVar5;
  cbtBroadphaseProxy *pcVar6;
  cbtCollisionAlgorithm *pcVar7;
  anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 aVar8;
  cbtBroadphaseProxy *pcVar9;
  cbtCollisionAlgorithm *pcVar10;
  anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 aVar11;
  int iVar12;
  long lVar13;
  cbtBroadphaseProxy *pcVar14;
  cbtBroadphaseProxy **ppcVar15;
  ulong uVar16;
  cbtBroadphaseProxy *pcVar17;
  
  iVar12 = (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
             _vptr_cbtOverlappingPairCallback[0xf])();
  if ((char)iVar12 == '\0') {
    pcVar14 = proxy1;
    pcVar17 = proxy0;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      pcVar14 = proxy0;
      pcVar17 = proxy1;
    }
    uVar2 = (this->m_overlappingPairArray).m_size;
    if (0 < (int)uVar2) {
      ppcVar15 = &((this->m_overlappingPairArray).m_data)->m_pProxy1;
      uVar16 = 0;
      do {
        if ((((cbtBroadphasePair *)(ppcVar15 + -1))->m_pProxy0 == pcVar14) && (*ppcVar15 == pcVar17)
           ) goto LAB_008c5563;
        uVar16 = uVar16 + 1;
        ppcVar15 = ppcVar15 + 4;
      } while (uVar2 != uVar16);
    }
    uVar16 = (ulong)uVar2;
LAB_008c5563:
    iVar12 = (int)uVar16;
    pcVar17 = proxy1;
    if (iVar12 < (int)uVar2) {
      pcVar3 = (this->m_overlappingPairArray).m_data;
      pcVar17 = (cbtBroadphaseProxy *)pcVar3[iVar12].field_3.m_internalInfo1;
      (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
        _vptr_cbtOverlappingPairCallback[8])(this,pcVar3 + iVar12);
      pcVar4 = this->m_ghostPairCallback;
      if (pcVar4 != (cbtOverlappingPairCallback *)0x0) {
        (*pcVar4->_vptr_cbtOverlappingPairCallback[3])(pcVar4,proxy0,proxy1,dispatcher);
      }
      lVar13 = (long)(this->m_overlappingPairArray).m_capacity;
      pcVar5 = (this->m_overlappingPairArray).m_data;
      pcVar3 = pcVar5 + iVar12;
      pcVar14 = pcVar3->m_pProxy0;
      pcVar6 = pcVar3->m_pProxy1;
      pcVar7 = pcVar3->m_algorithm;
      aVar8 = pcVar3->field_3;
      pcVar3 = pcVar5 + lVar13 + -1;
      pcVar9 = pcVar3->m_pProxy1;
      pcVar10 = pcVar3->m_algorithm;
      aVar11 = pcVar3->field_3;
      pcVar5 = pcVar5 + iVar12;
      pcVar5->m_pProxy0 = pcVar3->m_pProxy0;
      pcVar5->m_pProxy1 = pcVar9;
      pcVar5->m_algorithm = pcVar10;
      pcVar5->field_3 = aVar11;
      pcVar3 = (this->m_overlappingPairArray).m_data + lVar13 + -1;
      pcVar3->m_pProxy0 = pcVar14;
      pcVar3->m_pProxy1 = pcVar6;
      pcVar3->m_algorithm = pcVar7;
      pcVar3->field_3 = aVar8;
      piVar1 = &(this->m_overlappingPairArray).m_size;
      *piVar1 = *piVar1 + -1;
    }
    if (iVar12 < (int)uVar2) {
      return pcVar17;
    }
  }
  return (void *)0x0;
}

Assistant:

void* cbtSortedOverlappingPairCache::removeOverlappingPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1, cbtDispatcher* dispatcher)
{
	if (!hasDeferredRemoval())
	{
		cbtBroadphasePair findPair(*proxy0, *proxy1);

		int findIndex = m_overlappingPairArray.findLinearSearch(findPair);
		if (findIndex < m_overlappingPairArray.size())
		{
			cbtBroadphasePair& pair = m_overlappingPairArray[findIndex];
			void* userData = pair.m_internalInfo1;
			cleanOverlappingPair(pair, dispatcher);
			if (m_ghostPairCallback)
				m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1, dispatcher);

			m_overlappingPairArray.swap(findIndex, m_overlappingPairArray.capacity() - 1);
			m_overlappingPairArray.pop_back();
			return userData;
		}
	}

	return 0;
}